

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O0

int parseResultFromIoTHub(char *json_response,char **uploadCorrelationId,char **azureBlobSasUri)

{
  int iVar1;
  JSON_Value *value;
  LOGGER_LOG p_Var2;
  JSON_Object *object;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  STRING_HANDLE handle;
  STRING_HANDLE handle_00;
  LOGGER_LOG l_11;
  LOGGER_LOG l_10;
  LOGGER_LOG l_9;
  LOGGER_LOG l_8;
  STRING_HANDLE sas_uri;
  LOGGER_LOG l_7;
  LOGGER_LOG l_6;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  STRING_HANDLE filename;
  char *json_sas_token;
  char *json_blob_name;
  char *json_container_name;
  char *json_hostname;
  char *json_corr_id;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  JSON_Value *json;
  JSON_Object *json_obj;
  int result;
  char **azureBlobSasUri_local;
  char **uploadCorrelationId_local;
  char *json_response_local;
  
  value = json_parse_string(json_response);
  if (value == (JSON_Value *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                ,"parseResultFromIoTHub",0xb4,1,"unable to json_parse_string");
    }
    json_obj._4_4_ = 0xb5;
  }
  else {
    object = json_value_get_object(value);
    if (object == (JSON_Object *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                  ,"parseResultFromIoTHub",0xbc,1,"unable to get json_value_get_object");
      }
      json_obj._4_4_ = 0xbd;
    }
    else {
      pcVar3 = json_object_get_string(object,"correlationId");
      if (pcVar3 == (char *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                    ,"parseResultFromIoTHub",0xca,1,"unable to retrieve correlation Id from json");
        }
        json_obj._4_4_ = 0xcb;
      }
      else {
        pcVar4 = json_object_get_string(object,"hostName");
        if (pcVar4 == (char *)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                      ,"parseResultFromIoTHub",0xcf,1,"unable to retrieve hostname Id from json");
          }
          json_obj._4_4_ = 0xd0;
        }
        else {
          pcVar5 = json_object_get_string(object,"containerName");
          if (pcVar5 == (char *)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                        ,"parseResultFromIoTHub",0xd4,1,
                        "unable to retrieve container name Id from json");
            }
            json_obj._4_4_ = 0xd5;
          }
          else {
            pcVar6 = json_object_get_string(object,"blobName");
            if (pcVar6 == (char *)0x0) {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                          ,"parseResultFromIoTHub",0xd9,1,
                          "unable to retrieve blob name Id from json");
              }
              json_obj._4_4_ = 0xda;
            }
            else {
              pcVar7 = json_object_get_string(object,"sasToken");
              if (pcVar7 == (char *)0x0) {
                p_Var2 = xlogging_get_log_function();
                if (p_Var2 != (LOGGER_LOG)0x0) {
                  (*p_Var2)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                            ,"parseResultFromIoTHub",0xde,1,"unable to retrieve sas token from json"
                           );
                }
                json_obj._4_4_ = 0xdf;
              }
              else {
                handle = URL_EncodeString(pcVar6);
                if (handle == (STRING_HANDLE)0x0) {
                  p_Var2 = xlogging_get_log_function();
                  if (p_Var2 != (LOGGER_LOG)0x0) {
                    (*p_Var2)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                              ,"parseResultFromIoTHub",0xe3,1,"unable to URL encode of filename");
                  }
                  json_obj._4_4_ = 0xe4;
                }
                else {
                  handle_00 = STRING_new();
                  if (handle_00 == (STRING_HANDLE)0x0) {
                    p_Var2 = xlogging_get_log_function();
                    if (p_Var2 != (LOGGER_LOG)0x0) {
                      (*p_Var2)(AZ_LOG_ERROR,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                ,"parseResultFromIoTHub",0xec,1,
                                "Failed to allocate SAS URI STRING_HANDLE");
                    }
                    json_obj._4_4_ = 0xed;
                  }
                  else {
                    pcVar6 = STRING_c_str(handle);
                    iVar1 = STRING_sprintf(handle_00,"https://%s/%s/%s%s",pcVar4,pcVar5,pcVar6,
                                           pcVar7);
                    if (iVar1 == 0) {
                      iVar1 = mallocAndStrcpy_s(uploadCorrelationId,pcVar3);
                      if (iVar1 == 0) {
                        pcVar3 = STRING_c_str(handle_00);
                        iVar1 = mallocAndStrcpy_s(azureBlobSasUri,pcVar3);
                        if (iVar1 == 0) {
                          json_obj._4_4_ = 0;
                        }
                        else {
                          p_Var2 = xlogging_get_log_function();
                          if (p_Var2 != (LOGGER_LOG)0x0) {
                            (*p_Var2)(AZ_LOG_ERROR,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                      ,"parseResultFromIoTHub",0xfd,1,"unable to copy SAS URI");
                          }
                          free(*uploadCorrelationId);
                          *uploadCorrelationId = (char *)0x0;
                          json_obj._4_4_ = 0x100;
                        }
                      }
                      else {
                        p_Var2 = xlogging_get_log_function();
                        if (p_Var2 != (LOGGER_LOG)0x0) {
                          (*p_Var2)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                    ,"parseResultFromIoTHub",0xf8,1,"unable to copy correlation Id")
                          ;
                        }
                        json_obj._4_4_ = 0xf9;
                      }
                    }
                    else {
                      p_Var2 = xlogging_get_log_function();
                      if (p_Var2 != (LOGGER_LOG)0x0) {
                        (*p_Var2)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                                  ,"parseResultFromIoTHub",0xf3,1,"unable to construct uri string");
                      }
                      json_obj._4_4_ = 0xf4;
                    }
                    STRING_delete(handle_00);
                  }
                  STRING_delete(handle);
                }
              }
            }
          }
        }
      }
    }
    json_value_free(value);
  }
  return json_obj._4_4_;
}

Assistant:

static int parseResultFromIoTHub(const char* json_response, char** uploadCorrelationId, char** azureBlobSasUri)
{
    int result;
    JSON_Object* json_obj;
    JSON_Value* json = json_parse_string(json_response);

    if (json == NULL)
    {
        LogError("unable to json_parse_string");
        result = MU_FAILURE;

    }
    else
    {
        if ((json_obj = json_value_get_object(json)) == NULL)
        {
            LogError("unable to get json_value_get_object");
            result = MU_FAILURE;
        }
        else
        {
            const char* json_corr_id;
            const char* json_hostname;
            const char* json_container_name;
            const char* json_blob_name;
            const char* json_sas_token;
            STRING_HANDLE filename;

            if ((json_corr_id = json_object_get_string(json_obj, "correlationId")) == NULL)
            {
                LogError("unable to retrieve correlation Id from json");
                result = MU_FAILURE;
            }
            else if ((json_hostname = json_object_get_string(json_obj, "hostName")) == NULL)
            {
                LogError("unable to retrieve hostname Id from json");
                result = MU_FAILURE;
            }
            else if ((json_container_name = json_object_get_string(json_obj, "containerName")) == NULL)
            {
                LogError("unable to retrieve container name Id from json");
                result = MU_FAILURE;
            }
            else if ((json_blob_name = json_object_get_string(json_obj, "blobName")) == NULL)
            {
                LogError("unable to retrieve blob name Id from json");
                result = MU_FAILURE;
            }
            else if ((json_sas_token = json_object_get_string(json_obj, "sasToken")) == NULL)
            {
                LogError("unable to retrieve sas token from json");
                result = MU_FAILURE;
            }
            else if ((filename = URL_EncodeString(json_blob_name)) == NULL)
            {
                LogError("unable to URL encode of filename");
                result = MU_FAILURE;
            }
            else
            {
                STRING_HANDLE sas_uri;

                if ((sas_uri = STRING_new()) == NULL)
                {
                    LogError("Failed to allocate SAS URI STRING_HANDLE");
                    result = MU_FAILURE;
                }
                else
                {
                    if (STRING_sprintf(sas_uri, "https://%s/%s/%s%s", json_hostname, json_container_name, STRING_c_str(filename), json_sas_token) != 0)
                    {
                        LogError("unable to construct uri string");
                        result = MU_FAILURE;
                    }
                    else if (mallocAndStrcpy_s(uploadCorrelationId, json_corr_id) != 0)
                    {
                        LogError("unable to copy correlation Id");
                        result = MU_FAILURE;
                    }
                    else if (mallocAndStrcpy_s(azureBlobSasUri, STRING_c_str(sas_uri)) != 0)
                    {
                        LogError("unable to copy SAS URI");
                        free(*uploadCorrelationId);
                        *uploadCorrelationId = NULL;
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                    
                    STRING_delete(sas_uri);
                }

                STRING_delete(filename);
            }
        }

        json_value_free(json);
    }

    return result;
}